

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

void fio_listen2cluster(void *ignore)

{
  fio_lock_i fVar1;
  uint uVar2;
  undefined8 *protocol_;
  int *piVar3;
  fio_lock_i ret;
  timespec local_18;
  
  LOCK();
  UNLOCK();
  local_18.tv_sec._0_1_ = cluster_data.lock;
  if (cluster_data.lock != '\0') {
    do {
      cluster_data.lock = '\x01';
      local_18.tv_sec = 0;
      local_18.tv_nsec = 1;
      nanosleep(&local_18,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_18.tv_sec._0_1_ = cluster_data.lock;
    } while (cluster_data.lock != '\0');
  }
  cluster_data.lock = '\x01';
  cluster_data.uuid = fio_socket(cluster_data.name,(char *)0x0,'\x01');
  fVar1 = cluster_data.lock;
  LOCK();
  cluster_data.lock = '\0';
  UNLOCK();
  local_18.tv_sec = CONCAT71(local_18.tv_sec._1_7_,fVar1);
  if (cluster_data.uuid < 0) {
    fio_listen2cluster_cold_1();
  }
  else {
    protocol_ = (undefined8 *)malloc(0x30);
    if (protocol_ != (undefined8 *)0x0) {
      *protocol_ = fio_cluster_listen_accept;
      protocol_[1] = 0;
      protocol_[2] = mock_on_shutdown_eternal;
      protocol_[3] = fio_cluster_listen_on_close;
      protocol_[4] = mock_ping_eternal;
      protocol_[5] = 0;
      if (4 < FIO_LOG_LEVEL) {
        uVar2 = getpid();
        FIO_LOG2STDERR("DEBUG (/workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:6233): (%d) Listening to cluster: %s"
                       ,(ulong)uVar2,0x18b4f9);
      }
      fio_attach__internal((void *)cluster_data.uuid,protocol_);
      return;
    }
  }
  if (0 < FIO_LOG_LEVEL) {
    FIO_LOG2STDERR(
                  "FATAL: memory allocation error /workspace/llm4binary/github/license_all_cmakelists_25/1byte2bytes[P]LotteHTTP/facil.io-0.7.3/lib/facil/fio.c:6225"
                  );
  }
  kill(0,2);
  piVar3 = __errno_location();
  exit(*piVar3);
}

Assistant:

static void fio_listen2cluster(void *ignore) {
  /* this is called for each `fork`, but we only need this to run once. */
  fio_lock(&cluster_data.lock);
  cluster_data.uuid = fio_socket(cluster_data.name, NULL, 1);
  fio_unlock(&cluster_data.lock);
  if (cluster_data.uuid < 0) {
    FIO_LOG_FATAL("(facil.io cluster) failed to open cluster socket.");
    perror("             check file permissions. errno:");
    exit(errno);
  }
  fio_protocol_s *p = malloc(sizeof(*p));
  FIO_ASSERT_ALLOC(p);
  *p = (fio_protocol_s){
      .on_data = fio_cluster_listen_accept,
      .on_shutdown = mock_on_shutdown_eternal,
      .ping = mock_ping_eternal,
      .on_close = fio_cluster_listen_on_close,
  };
  FIO_LOG_DEBUG("(%d) Listening to cluster: %s", (int)getpid(),
                cluster_data.name);
  fio_attach(cluster_data.uuid, p);
  (void)ignore;
}